

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositedBupOutputter.cpp
# Opt level: O1

void __thiscall
CompositedBupOutputter::newFace
          (CompositedBupOutputter *this,Image *img,Point pos,string *name,
          vector<MaskRect,_std::allocator<MaskRect>_> *mask)

{
  pointer pcVar1;
  long *plVar2;
  long *plVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_88 [2];
  long local_78 [2];
  vector<MaskRect,_std::allocator<MaskRect>_> local_68;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  (this->withFace).size = (this->base).size;
  std::vector<Color,_std::allocator<Color>_>::operator=
            (&(this->withFace).colorData,&(this->base).colorData);
  std::__cxx11::string::_M_replace
            ((ulong)&this->withMouthName,0,(char *)(this->withMouthName)._M_string_length,0x1163d1);
  if ((img->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (img->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_88[0] = local_78;
    pcVar1 = (this->baseName)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_88,pcVar1,pcVar1 + (this->baseName)._M_string_length);
    std::__cxx11::string::append((char *)local_88);
    plVar2 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_88,(ulong)(name->_M_dataplus)._M_p);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_40 = *plVar3;
      lStack_38 = plVar2[3];
      local_50 = &local_40;
    }
    else {
      local_40 = *plVar3;
      local_50 = (long *)*plVar2;
    }
    local_48 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::operator=((string *)&this->withFaceName,(string *)&local_50);
    if (local_50 != &local_40) {
      operator_delete(local_50,local_40 + 1);
    }
    if (local_88[0] != local_78) {
      operator_delete(local_88[0],local_78[0] + 1);
    }
    std::vector<MaskRect,_std::allocator<MaskRect>_>::vector(&local_68,mask);
    Image::drawOnto(img,&this->withFace,pos,&local_68);
    if (local_68.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_68.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl
                            .super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl
                            .super__Vector_impl_data._M_start);
    }
    return;
  }
  std::__cxx11::string::_M_assign((string *)&this->withFaceName);
  return;
}

Assistant:

void newFace(const Image& img, Point pos, const std::string& name, const std::vector<MaskRect>& mask) override {
		withFace = base;
		withMouthName = "";
		if (img.empty()) {
			withFaceName = baseName;
		} else {
			withFaceName = baseName + "_" + name;
			img.drawOnto(withFace, pos, mask);
		}
	}